

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_0::CWriter::WriteLocals
          (CWriter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *index_to_name)

{
  uint uVar1;
  int iVar2;
  Func *pFVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer u;
  pointer pbVar6;
  size_t size;
  ulong uVar7;
  long lVar8;
  Type type;
  ulong uVar9;
  pointer ppVar10;
  char *__s;
  uint uVar11;
  string_view name;
  string_view include_condition;
  string local_50;
  
  pFVar3 = this->func_;
  pTVar4 = (pFVar3->decl).sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar5 = (pFVar3->decl).sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = 0;
  do {
    uVar1 = *(uint *)((long)&DAT_0017285c + lVar8);
    type.type_index_ = 0;
    type.enum_ = uVar1;
    if (type == (Type)0xffffffeb) {
      __assert_fail("!EnumIsReferenceWithIndex(enum_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/type.h"
                    ,0x43,"wabt::Type::Type(Enum)");
    }
    ppVar10 = (pFVar3->local_types).decls_.
              super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    u = (pFVar3->local_types).decls_.
        super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar10 != u) {
      uVar9 = 0;
      uVar7 = (ulong)((long)pTVar4 - (long)pTVar5) >> 3 & 0xffffffff;
      uVar11 = 0;
      do {
        if (ppVar10->first != type) goto LAB_00147920;
        if (uVar9 == 0) {
          Write(this,type);
          WriteData(this," ",1);
          include_condition._M_str = "exceptions";
          include_condition._M_len = 10;
          PushFuncSection(this,include_condition);
          WriteData(this,"volatile ",9);
          PushFuncSection(this,(string_view)(ZEXT816(0x16cb22) << 0x40));
          this->indent_ = this->indent_ + 4;
        }
        else {
          WriteData(this,", ",2);
          if ((uVar9 & 7) == 0) {
            if (this->consecutive_newline_count_ < 2) {
              WriteData(this,"\n",1);
              this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
            }
            this->should_write_indent_next_ = true;
          }
        }
        pbVar6 = (index_to_name->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        name._M_str = pbVar6[uVar7]._M_dataplus._M_p;
        name._M_len = pbVar6[uVar7]._M_string_length;
        (anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
                  (&local_50,(CWriter *)this,name,false);
        WriteData(this,local_50._M_dataplus._M_p,local_50._M_string_length);
        WriteData(this," = ",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        __s = "wasm_rt_funcref_null_value";
        switch(uVar1) {
        case 0xffffffe9:
          __s = "wasm_rt_exnref_null_value";
          break;
        case 0xffffffea:
        case 0xffffffec:
        case 0xffffffed:
        case 0xffffffee:
switchD_001478c1_caseD_ffffffea:
          size = 1;
          __s = "0";
          goto LAB_0014790b;
        case 0xffffffeb:
          abort();
        case 0xffffffef:
          __s = "wasm_rt_externref_null_value";
          break;
        case 0xfffffff0:
          break;
        default:
          if (uVar1 != 0xfffffffb) goto switchD_001478c1_caseD_ffffffea;
          size = 0x1b;
          __s = "simde_wasm_i64x2_make(0, 0)";
          goto LAB_0014790b;
        }
        size = strlen(__s);
LAB_0014790b:
        WriteData(this,__s,size);
        uVar9 = uVar9 + 1;
LAB_00147920:
        uVar11 = uVar11 + 1;
        if (ppVar10->second <= uVar11) {
          uVar11 = 0;
          ppVar10 = ppVar10 + 1;
        }
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (uVar11 != 0 || ppVar10 != u);
      if (uVar9 != 0) {
        iVar2 = this->indent_;
        this->indent_ = iVar2 + -4;
        if (iVar2 < 4) {
          __assert_fail("indent_ >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                        ,0x41c,"void wabt::(anonymous namespace)::CWriter::Dedent(int)");
        }
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])0x16ea3a,(Newline *)u);
      }
    }
    lVar8 = lVar8 + 4;
    if (lVar8 == 0x20) {
      return;
    }
  } while( true );
}

Assistant:

void CWriter::WriteLocals(const std::vector<std::string>& index_to_name) {
  Index num_params = func_->GetNumParams();
  WriteVarsByType(
      func_->local_types, [](auto x) { return x; },
      [&](Index local_index, Type local_type) {
        Write(DefineParamName(index_to_name[num_params + local_index]), " = ");
        if (local_type.IsRef()) {
          Write(GetReferenceNullValue(local_type));
        } else if (local_type == Type::V128) {
          Write("simde_wasm_i64x2_make(0, 0)");
        } else {
          Write("0");
        }
      },
      true);
}